

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::Role::~Role(Role *this)

{
  Role *this_local;
  
  omittable_field<discordpp::RoleTags>::~omittable_field(&this->tags);
  field<bool>::~field(&this->mentionable);
  field<bool>::~field(&this->managed);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->permissions);
  field<int>::~field(&this->position);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~nullable_omittable_field(&this->unicode_emoji);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~nullable_omittable_field(&this->icon);
  field<bool>::~field(&this->hoist);
  field<int>::~field(&this->color);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->name);
  field<discordpp::Snowflake>::~field(&this->id);
  return;
}

Assistant:

Role(
        field<Snowflake> id = uninitialized,
        field<std::string> name = uninitialized,
        field<int> color = uninitialized,
        field<bool> hoist = uninitialized,
        nullable_omittable_field<std::string> icon = omitted,
        nullable_omittable_field<std::string> unicode_emoji = omitted,
        field<int> position = uninitialized,
        field<std::string> permissions = uninitialized,
        field<bool> managed = uninitialized,
        field<bool> mentionable = uninitialized,
        omittable_field<RoleTags> tags = omitted
    ):
        id(id),
        name(name),
        color(color),
        hoist(hoist),
        icon(icon),
        unicode_emoji(unicode_emoji),
        position(position),
        permissions(permissions),
        managed(managed),
        mentionable(mentionable),
        tags(tags)
    {}